

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O3

void __thiscall
icu_63::DecimalFormat::adoptCurrencyPluralInfo(DecimalFormat *this,CurrencyPluralInfo *toAdopt)

{
  DecimalFormatProperties *pDVar1;
  CurrencyPluralInfo *pCVar2;
  UErrorCode localStatus;
  UErrorCode local_1c;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  pCVar2 = (pDVar1->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
  if (pCVar2 != (CurrencyPluralInfo *)0x0) {
    (*(pCVar2->super_UObject)._vptr_UObject[1])();
  }
  (pDVar1->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr = toAdopt
  ;
  local_1c = U_ZERO_ERROR;
  touch(this,&local_1c);
  return;
}

Assistant:

void DecimalFormat::adoptCurrencyPluralInfo(CurrencyPluralInfo* toAdopt) {
    fields->properties->currencyPluralInfo.fPtr.adoptInstead(toAdopt);
    touchNoError();
}